

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::handleLengthMethod
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *intermNode)

{
  TIntermediate *pTVar1;
  TIntermNode *pTVar2;
  TFunction *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TQualifier *qualifier;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar8;
  TParseContext *pTVar9;
  TType local_180;
  TType local_e8;
  long *local_50;
  TIntermTyped *typed;
  TString *name;
  TType *type;
  TIntermNode *pTStack_30;
  int length;
  TIntermNode *intermNode_local;
  TFunction *function_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  type._4_4_ = 0;
  pTStack_30 = intermNode;
  intermNode_local = (TIntermNode *)function;
  function_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
  pTVar3 = function_local;
  if (iVar5 < 1) {
    iVar5 = (*pTStack_30->_vptr_TIntermNode[3])();
    name = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0xf0))();
    uVar7 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[2].freeList)();
    if ((uVar7 & 1) == 0) {
      uVar7 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[2].currentPageOffset)();
      if ((uVar7 & 1) == 0) {
        uVar7 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[2].headerSkip)();
        if ((uVar7 & 1) == 0) {
          bVar4 = TType::isCoopMat((TType *)name);
          if ((bVar4) || (bVar4 = TType::isCoopVecNV((TType *)name), bVar4)) {
            pTVar3 = function_local;
            pTVar2 = pTStack_30;
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            TType::TType(&local_180,EbtInt,EvqTemporary,1,0,0,false);
            this_local = (TParseContext *)
                         TIntermediate::addBuiltInFunctionCall
                                   (pTVar1,(TSourceLoc *)pTVar3,EOpArrayLength,true,pTVar2,
                                    &local_180);
            TType::~TType(&local_180);
            return (TIntermTyped *)this_local;
          }
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,function_local,".length()","unexpected use of .length()","");
        }
        else {
          type._4_4_ = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].pageSize)();
        }
      }
      else {
        type._4_4_ = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].alignment)();
      }
    }
    else {
      uVar7 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[2].stack.
                        super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                        ._M_impl.super__Vector_impl_data._M_start)();
      if ((uVar7 & 1) == 0) {
        lVar8 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].currentPageOffset)()
        ;
        if (lVar8 != 0) {
          pTVar9 = (TParseContext *)
                   (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].currentPageOffset
                   )();
          return (TIntermTyped *)pTVar9;
        }
        type._4_4_ = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].headerSkip)();
      }
      else {
        iVar5 = (*pTStack_30->_vptr_TIntermNode[0xc])();
        if ((CONCAT44(extraout_var_01,iVar5) == 0) ||
           (bVar4 = isIoResizeArray(this,(TType *)name), !bVar4)) {
          iVar5 = (*pTStack_30->_vptr_TIntermNode[3])();
          local_50 = (long *)CONCAT44(extraout_var_03,iVar5);
          if ((local_50 != (long *)0x0) &&
             (lVar8 = (**(code **)(*local_50 + 0x108))(),
             ((uint)(*(ulong *)(lVar8 + 8) >> 7) & 0x1ff) == 0x47)) {
            TParseVersions::requireProfile
                      ((TParseVersions *)this,(TSourceLoc *)function_local,8,
                       "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)"
                      );
            type._4_4_ = ((this->resources).maxSamples + 0x1f) / 0x20;
          }
        }
        else {
          iVar5 = (*pTStack_30->_vptr_TIntermNode[0xc])();
          typed = (TIntermTyped *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 400))();
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)typed,"gl_in");
          if ((((bVar4) ||
               (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                         *)typed,"gl_out"), bVar4)) ||
              (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        *)typed,"gl_MeshVerticesNV"), bVar4)) ||
             (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)typed,"gl_MeshPrimitivesNV"), bVar4)) {
            qualifier = (TQualifier *)
                        (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)
                                  ();
            type._4_4_ = getIoArrayImplicitSize(this,qualifier,(TString *)0x0);
          }
        }
        if (type._4_4_ == 0) {
          iVar5 = (*pTStack_30->_vptr_TIntermNode[0xc])();
          if ((CONCAT44(extraout_var_04,iVar5) == 0) ||
             (bVar4 = isIoResizeArray(this,(TType *)name), pTVar3 = function_local, !bVar4)) {
            iVar5 = (*pTStack_30->_vptr_TIntermNode[3])();
            bVar4 = isRuntimeLength(this,(TIntermTyped *)CONCAT44(extraout_var_06,iVar5));
            pTVar3 = function_local;
            pTVar2 = pTStack_30;
            if (bVar4) {
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              TType::TType(&local_e8,EbtInt,EvqTemporary,1,0,0,false);
              this_local = (TParseContext *)
                           TIntermediate::addBuiltInFunctionCall
                                     (pTVar1,(TSourceLoc *)pTVar3,EOpArrayLength,true,pTVar2,
                                      &local_e8);
              TType::~TType(&local_e8);
              return (TIntermTyped *)this_local;
            }
            iVar5 = (*intermNode_local->_vptr_TIntermNode[3])();
            pcVar6 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_07,iVar5));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar3,"",pcVar6,
                       "array must be declared with a size before using this method");
          }
          else {
            iVar5 = (*intermNode_local->_vptr_TIntermNode[3])();
            pcVar6 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_05,iVar5));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar3,"",pcVar6,
                       "array must first be sized by a redeclaration or layout qualifier");
          }
        }
      }
    }
  }
  else {
    iVar5 = (*intermNode_local->_vptr_TIntermNode[3])();
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var,iVar5));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar3,"method does not accept any arguments",pcVar6,"");
  }
  if (type._4_4_ == 0) {
    type._4_4_ = 1;
  }
  pTVar9 = (TParseContext *)
           TIntermediate::addConstantUnion
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,type._4_4_,
                      (TSourceLoc *)function_local,false);
  return (TIntermTyped *)pTVar9;
}

Assistant:

TIntermTyped* TParseContext::handleLengthMethod(const TSourceLoc& loc, TFunction* function, TIntermNode* intermNode)
{
    int length = 0;

    if (function->getParamCount() > 0)
        error(loc, "method does not accept any arguments", function->getName().c_str(), "");
    else {
        const TType& type = intermNode->getAsTyped()->getType();
        if (type.isArray()) {
            if (type.isUnsizedArray()) {
                if (intermNode->getAsSymbolNode() && isIoResizeArray(type)) {
                    // We could be between a layout declaration that gives a built-in io array implicit size and
                    // a user redeclaration of that array, meaning we have to substitute its implicit size here
                    // without actually redeclaring the array.  (It is an error to use a member before the
                    // redeclaration, but not an error to use the array name itself.)
                    const TString& name = intermNode->getAsSymbolNode()->getName();
                    if (name == "gl_in" || name == "gl_out" || name == "gl_MeshVerticesNV" ||
                        name == "gl_MeshPrimitivesNV") {
                        length = getIoArrayImplicitSize(type.getQualifier());
                    }
                } else if (const auto typed = intermNode->getAsTyped()) {
                    if (typed->getQualifier().builtIn == EbvSampleMask) {
                        requireProfile(loc, EEsProfile, "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)");
                        length = (resources.maxSamples + 31) / 32;
                    }
                }
                if (length == 0) {
                    if (intermNode->getAsSymbolNode() && isIoResizeArray(type))
                        error(loc, "", function->getName().c_str(), "array must first be sized by a redeclaration or layout qualifier");
                    else if (isRuntimeLength(*intermNode->getAsTyped())) {
                        // Create a unary op and let the back end handle it
                        return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
                    } else
                        error(loc, "", function->getName().c_str(), "array must be declared with a size before using this method");
                }
            } else if (type.getOuterArrayNode()) {
                // If the array's outer size is specified by an intermediate node, it means the array's length
                // was specified by a specialization constant. In such a case, we should return the node of the
                // specialization constants to represent the length.
                return type.getOuterArrayNode();
            } else
                length = type.getOuterArraySize();
        } else if (type.isMatrix())
            length = type.getMatrixCols();
        else if (type.isVector())
            length = type.getVectorSize();
        else if (type.isCoopMat() || type.isCoopVecNV())
            return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
        else {
            // we should not get here, because earlier semantic checking should have prevented this path
            error(loc, ".length()", "unexpected use of .length()", "");
        }
    }

    if (length == 0)
        length = 1;

    return intermediate.addConstantUnion(length, loc);
}